

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestAssert.h
# Opt level: O3

void CppUnit::assertEquals<double>
               (double *expected,double *actual,SourceLine *sourceLine,string *message)

{
  double x;
  assertion_traits<double> *this;
  long *local_f0 [2];
  long local_e0 [2];
  string local_d0;
  string local_b0;
  AdditionalMessage local_90 [120];
  
  x = *expected;
  if ((x != *actual) || (NAN(x) || NAN(*actual))) {
    this = (assertion_traits<double> *)actual;
    assertion_traits<double>::toString_abi_cxx11_(&local_b0,(assertion_traits<double> *)actual,x);
    assertion_traits<double>::toString_abi_cxx11_(&local_d0,this,*actual);
    CppUnit::AdditionalMessage::AdditionalMessage(local_90,(string *)message);
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"equality assertion failed","");
    CppUnit::Asserter::failNotEqual(&local_b0,&local_d0,sourceLine,local_90,local_f0);
    if (local_f0[0] != local_e0) {
      operator_delete(local_f0[0],local_e0[0] + 1);
    }
    CppUnit::Message::~Message((Message *)local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void assertEquals( const T& expected,
                   const T& actual,
                   SourceLine sourceLine,
                   const std::string &message )
{
  if ( !assertion_traits<T>::equal(expected,actual) ) // lazy toString conversion...
  {
    Asserter::failNotEqual( assertion_traits<T>::toString(expected),
                            assertion_traits<T>::toString(actual),
                            sourceLine,
                            message );
  }
}